

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::hyperChooseColumnBasicFeasibilityChange(HEkkPrimal *this)

{
  int iCol;
  HEkk *pHVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  HighsInt iEntry;
  ulong uVar6;
  double dVar7;
  HighsInt to_entry;
  
  if (this->use_hyper_chuzc == true) {
    uVar5 = 0;
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2b,0);
    pHVar1 = this->ekk_instance_;
    bVar2 = HSimplexNla::sparseLoopStyle
                      (&pHVar1->simplex_nla_,(this->row_basic_feasibility_change).count,
                       this->num_col,&to_entry);
    uVar6 = (ulong)(uint)to_entry;
    if (to_entry < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if (bVar2) {
        iVar4 = (this->row_basic_feasibility_change).index.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar5];
      }
      else {
        iVar4 = (int)uVar5;
      }
      dVar7 = (double)-(int)(pHVar1->basis_).nonbasicMove_.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar4] *
              (pHVar1->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4];
      if (this->dual_feasibility_tolerance <= dVar7 && dVar7 != this->dual_feasibility_tolerance) {
        hyperChooseColumnChangedInfeasibility(this,dVar7,iVar4);
      }
    }
    bVar2 = HSimplexNla::sparseLoopStyle
                      (&this->ekk_instance_->simplex_nla_,(this->col_basic_feasibility_change).count
                       ,this->num_row,&to_entry);
    uVar5 = 0;
    uVar6 = (ulong)(uint)to_entry;
    if (to_entry < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if (bVar2) {
        iVar4 = (this->col_basic_feasibility_change).index.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar5];
      }
      else {
        iVar4 = (int)uVar5;
      }
      lVar3 = (long)iVar4 + (long)this->num_col;
      dVar7 = (double)-(int)(pHVar1->basis_).nonbasicMove_.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar3] *
              (pHVar1->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      if (this->dual_feasibility_tolerance <= dVar7 && dVar7 != this->dual_feasibility_tolerance) {
        hyperChooseColumnChangedInfeasibility(this,dVar7,(HighsInt)lVar3);
      }
    }
    iVar4 = (this->nonbasic_free_col_set).count_;
    if (iVar4 != 0 && this->row_out < 0) {
      for (lVar3 = 0; lVar3 < iVar4; lVar3 = lVar3 + 1) {
        iCol = (this->nonbasic_free_col_set).entry_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar3];
        dVar7 = ABS((pHVar1->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iCol]);
        if (this->dual_feasibility_tolerance <= dVar7 && dVar7 != this->dual_feasibility_tolerance)
        {
          hyperChooseColumnChangedInfeasibility(this,dVar7,iCol);
          iVar4 = (this->nonbasic_free_col_set).count_;
        }
      }
    }
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2b,0);
  }
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumnBasicFeasibilityChange() {
  if (!use_hyper_chuzc) return;
  analysis->simplexTimerStart(ChuzcHyperBasicFeasibilityChangeClock);
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  HighsInt to_entry;
  const bool use_row_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      row_basic_feasibility_change.count, num_col, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iCol =
        use_row_indices ? row_basic_feasibility_change.index[iEntry] : iEntry;
    double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
    if (dual_infeasibility > dual_feasibility_tolerance)
      hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
  }
  const bool use_col_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      col_basic_feasibility_change.count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow =
        use_col_indices ? col_basic_feasibility_change.index[iEntry] : iEntry;
    HighsInt iCol = num_col + iRow;
    double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
    if (dual_infeasibility > dual_feasibility_tolerance)
      hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
  }
  // Any nonbasic free columns will be handled explicitly in
  // hyperChooseColumnDualChange, so only look at them here if not
  // flipping
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  if (row_out < 0 && num_nonbasic_free_col) {
    const vector<HighsInt>& nonbasic_free_col_set_entry =
        nonbasic_free_col_set.entry();
    for (HighsInt iEntry = 0; iEntry < num_nonbasic_free_col; iEntry++) {
      HighsInt iCol = nonbasic_free_col_set_entry[iEntry];
      double dual_infeasibility = fabs(workDual[iCol]);
      if (dual_infeasibility > dual_feasibility_tolerance)
        hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
    }
  }
  analysis->simplexTimerStop(ChuzcHyperBasicFeasibilityChangeClock);
}